

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

int Diffusion::set_rho_flag(DiffusionForm compDiffusionType)

{
  Print *x;
  int in_EDI;
  int rho_flag;
  char (*in_stack_fffffffffffffe38) [21];
  Print *this;
  undefined4 in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe68;
  Print *in_stack_fffffffffffffe70;
  Print *in_stack_fffffffffffffeb0;
  int local_10;
  
  local_10 = 0;
  if (in_EDI == 0) {
    local_10 = 1;
  }
  else if (in_EDI == 1) {
    local_10 = 2;
  }
  else if (in_EDI == 2) {
    local_10 = 0;
  }
  else {
    amrex::OutStream();
    this = (Print *)&stack0xfffffffffffffe68;
    amrex::Print::Print(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    amrex::Print::operator<<(this,in_stack_fffffffffffffe38);
    x = amrex::Print::operator<<(this,(DiffusionForm *)in_stack_fffffffffffffe38);
    amrex::Print::operator<<(this,(char *)x);
    amrex::Print::~Print(in_stack_fffffffffffffeb0);
    amrex::Abort_host((char *)CONCAT44(in_EDI,in_stack_fffffffffffffe50));
  }
  return local_10;
}

Assistant:

int
Diffusion::set_rho_flag(const DiffusionForm compDiffusionType)
{
    int rho_flag = 0;

    switch (compDiffusionType)
    {
        case Laplacian_S:
            rho_flag = 0;
            break;

        case RhoInverse_Laplacian_S:
            rho_flag = 1;
            break;

        case Laplacian_SoverRho:
            rho_flag = 2;
            break;

        //NOTE: rho_flag = 3 is used in a different context for
        //      do_mom_diff==1

        default:
            amrex::Print() << "compDiffusionType = " << compDiffusionType << '\n';
            amrex::Abort("An unknown NavierStokesBase::DiffusionForm was used in set_rho_flag");
    }

    return rho_flag;
}